

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
basic_compact_json_encoder
          (basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
           *this,stream_sink<char> *sink,basic_json_encode_options<char> *options,
          allocator<char> *alloc)

{
  float_chars_format fVar1;
  basic_json_encode_options<char> *in_RDX;
  basic_json_visitor<char> *in_RDI;
  stream_sink<char> *in_stack_ffffffffffffff98;
  stream_sink<char> *in_stack_ffffffffffffffa0;
  allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>
  *this_00;
  basic_json_encode_options<char> *in_stack_ffffffffffffffa8;
  basic_json_visitor<char> *pbVar2;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  
  basic_json_visitor<char>::basic_json_visitor(in_RDI);
  in_RDI->_vptr_basic_json_visitor = (_func_int **)&PTR__basic_compact_json_encoder_013344f8;
  stream_sink<char>::stream_sink(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  basic_json_encode_options<char>::basic_json_encode_options
            ((basic_json_encode_options<char> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
            );
  pbVar2 = in_RDI + 0x2b;
  fVar1 = basic_json_encode_options<char>::float_format(in_RDX);
  basic_json_encode_options<char>::precision(in_RDX);
  detail::write_double::write_double
            ((write_double *)CONCAT17(fVar1,in_stack_ffffffffffffffb0),
             (float_chars_format)((ulong)pbVar2 >> 0x38),(int)pbVar2);
  this_00 = (allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>
             *)(in_RDI + 0x31);
  std::
  allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>
  ::allocator<char>(this_00,(allocator<char> *)in_stack_ffffffffffffff98);
  std::
  vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
  ::vector((vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
            *)this_00,(allocator_type *)in_stack_ffffffffffffff98);
  std::
  allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>
  ::~allocator((allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>
                *)0x2195fb);
  *(undefined4 *)&in_RDI[0x34]._vptr_basic_json_visitor = 0;
  return;
}

Assistant:

basic_compact_json_encoder(Sink&& sink, 
            const basic_json_encode_options<CharT>& options, 
            const Allocator& alloc = Allocator())
           : sink_(std::forward<Sink>(sink)),
             options_(options),
             fp_(options.float_format(), options.precision()),
             stack_(alloc),
             nesting_depth_(0)          
        {
        }